

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void cfd::core::ConfidentialNonce::CheckVersion(uint8_t version)

{
  CfdException *this;
  byte in_DIL;
  uchar local_41;
  undefined1 local_40 [32];
  
  if (in_DIL < 4) {
    return;
  }
  local_40._0_8_ = "cfdcore_elements_transaction.cpp";
  local_40._8_4_ = 0x145;
  local_40._16_8_ = "CheckVersion";
  logger::log<unsigned_char&>
            ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"Nonce version Invalid. version={}.",
             &local_41);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Nonce version Invalid.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialNonce::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 2) && (version != 3)) {
    warn(CFD_LOG_SOURCE, "Nonce version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Nonce version Invalid.");
  }
}